

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverBB.cpp
# Opt level: O3

void __thiscall chrono::ChSolverBB::ArchiveIN(ChSolverBB *this,ChArchiveIn *marchive)

{
  char *local_38;
  bool *local_30;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::ChSolverBB>(marchive);
  ChIterativeSolverVI::ArchiveIN(&this->super_ChIterativeSolverVI,marchive);
  local_30 = (bool *)&this->n_armijo;
  local_38 = "n_armijo";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x18))(marchive,&local_38);
  local_30 = (bool *)&this->max_armijo_backtrace;
  local_38 = "max_armijo_backtrace";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x18))(marchive,&local_38);
  local_30 = &(this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_use_precond;
  local_38 = "m_use_precond";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_38);
  return;
}

Assistant:

void ChSolverBB::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChSolverBB>();
    // deserialize parent class
    ChIterativeSolverVI::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(n_armijo);
    marchive >> CHNVP(max_armijo_backtrace);
    marchive >> CHNVP(m_use_precond);
}